

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_get.cpp
# Opt level: O3

double __thiscall UniValue::get_real(UniValue *this)

{
  uint uVar1;
  anon_unknown_dwarf_d90b26 *this_00;
  string *str;
  bool bVar2;
  runtime_error *this_01;
  istringstream text;
  double local_1a8;
  locale local_1a0 [8];
  double local_198 [4];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  if (this->typ == VNUM) {
    this_00 = (anon_unknown_dwarf_d90b26 *)(this->val)._M_dataplus._M_p;
    str = (string *)(this->val)._M_string_length;
    bVar2 = anon_unknown.dwarf_d90b26::ParsePrechecks(this_00,str);
    if ((bVar2) &&
       (((str < (string *)0x2 || (*this_00 != (anon_unknown_dwarf_d90b26)0x30)) ||
        (this_00[1] != (anon_unknown_dwarf_d90b26)0x78)))) {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_198,(string *)&this->val,_S_in);
      std::locale::classic();
      std::ios::imbue(local_1a0);
      std::locale::~locale(local_1a0);
      std::istream::_M_extract<double>(local_198);
      uVar1 = *(uint *)((long)auStack_178 + *(long *)((long)local_198[0] + -0x18));
      std::__cxx11::istringstream::~istringstream((istringstream *)local_198);
      std::ios_base::~ios_base(local_120);
      if ((uVar1 & 7) == 2) {
        return local_1a8;
      }
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"JSON double out of range");
  }
  else {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"JSON value is not a number as expected");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double UniValue::get_real() const
{
    if (typ != VNUM)
        throw std::runtime_error("JSON value is not a number as expected");
    double retval;
    if (!ParseDouble(getValStr(), &retval))
        throw std::runtime_error("JSON double out of range");
    return retval;
}